

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O0

int __thiscall Imf_2_5::TimeCode::binaryGroup(TimeCode *this,int group)

{
  uint uVar1;
  ArgExc *this_00;
  int minBit_00;
  int in_ESI;
  long in_RDI;
  int maxBit;
  int minBit;
  
  if ((0 < in_ESI) && (in_ESI < 9)) {
    minBit_00 = (in_ESI + -1) * 4;
    uVar1 = anon_unknown_1::bitField(*(uint *)(in_RDI + 4),minBit_00,minBit_00 + 3);
    return uVar1;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc
            (this_00,
             "Cannot extract binary group from time code user data.  Group number is out of range.")
  ;
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

int
TimeCode::binaryGroup (int group) const
{
    if (group < 1 || group > 8)
	throw IEX_NAMESPACE::ArgExc ("Cannot extract binary group from time code "
		           "user data.  Group number is out of range.");

    int minBit = 4 * (group - 1);
    int maxBit = minBit + 3;
    return int (bitField (_user, minBit, maxBit));
}